

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

MemoryRegionSection *
address_space_translate_internal
          (AddressSpaceDispatch *d,hwaddr addr,hwaddr *xlat,hwaddr *plen,_Bool resolve_subpage)

{
  undefined1 a [16];
  undefined1 a_00 [16];
  undefined1 a_01 [16];
  undefined1 b [16];
  undefined1 b_00 [16];
  _Bool _Var1;
  MemoryRegionSection *pMVar2;
  Int128 *pIVar3;
  uint64_t uVar4;
  undefined8 extraout_RDX;
  hwaddr a_02;
  uint64_t uVar5;
  Int128 *__return_storage_ptr__;
  undefined8 in_stack_ffffffffffffff08;
  undefined8 uVar6;
  undefined8 in_stack_ffffffffffffff10;
  Int128 diff;
  MemoryRegion_conflict *mr;
  MemoryRegionSection *section;
  _Bool resolve_subpage_local;
  hwaddr *plen_local;
  hwaddr *xlat_local;
  hwaddr addr_local;
  AddressSpaceDispatch *d_local;
  
  a_02 = addr;
  pMVar2 = address_space_lookup_region(d,addr,resolve_subpage);
  pIVar3 = (Int128 *)(addr - pMVar2->offset_within_address_space);
  *xlat = (long)pIVar3 + pMVar2->offset_within_region;
  _Var1 = memory_region_is_ram((MemoryRegion_conflict *)pMVar2->mr);
  if (_Var1) {
    __return_storage_ptr__ = *(Int128 **)&pMVar2->size;
    uVar4 = *(uint64_t *)((long)&pMVar2->size + 8);
    int128_make64(pIVar3,a_02);
    a._8_8_ = __return_storage_ptr__;
    a._0_8_ = uVar4;
    b._8_8_ = in_stack_ffffffffffffff10;
    b._0_8_ = in_stack_ffffffffffffff08;
    uVar5 = uVar4;
    pIVar3 = int128_sub(__return_storage_ptr__,(Int128)a,(Int128)b);
    uVar6 = extraout_RDX;
    int128_make64((Int128 *)*plen,uVar4);
    a_00._8_8_ = __return_storage_ptr__;
    a_00._0_8_ = uVar5;
    b_00._8_8_ = pIVar3;
    b_00._0_8_ = uVar6;
    int128_min(pIVar3,(Int128)a_00,(Int128)b_00);
    a_01._8_8_ = __return_storage_ptr__;
    a_01._0_8_ = uVar5;
    uVar4 = int128_get64((Int128)a_01);
    *plen = uVar4;
  }
  return pMVar2;
}

Assistant:

static MemoryRegionSection *
address_space_translate_internal(AddressSpaceDispatch *d, hwaddr addr, hwaddr *xlat,
                                 hwaddr *plen, bool resolve_subpage)
{
    MemoryRegionSection *section;
    MemoryRegion *mr;
    Int128 diff;

    section = address_space_lookup_region(d, addr, resolve_subpage);
    /* Compute offset within MemoryRegionSection */
    addr -= section->offset_within_address_space;

    /* Compute offset within MemoryRegion */
    *xlat = addr + section->offset_within_region;

    mr = section->mr;

    /* MMIO registers can be expected to perform full-width accesses based only
     * on their address, without considering adjacent registers that could
     * decode to completely different MemoryRegions.  When such registers
     * exist (e.g. I/O ports 0xcf8 and 0xcf9 on most PC chipsets), MMIO
     * regions overlap wildly.  For this reason we cannot clamp the accesses
     * here.
     *
     * If the length is small (as is the case for address_space_ldl/stl),
     * everything works fine.  If the incoming length is large, however,
     * the caller really has to do the clamping through memory_access_size.
     */
    if (memory_region_is_ram(mr)) {
        diff = int128_sub(section->size, int128_make64(addr));
        *plen = int128_get64(int128_min(diff, int128_make64(*plen)));
    }
    return section;
}